

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O1

void __thiscall npas4_AllocAll_Test::TestBody(npas4_AllocAll_Test *this)

{
  bool bVar1;
  long lVar2;
  double unaff_RBX;
  char *message;
  double unaff_R14;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  AssertHelper in_stack_ffffffffffffffd0;
  char local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  
  npas4::GetRAMSystemUsedByCurrentProcess();
  npas4::GetRAMVirtualUsedByCurrentProcess();
  lVar2 = std::chrono::_V2::system_clock::now();
  if (lVar2 == 0) {
    npas4::GetRAMSystemUsedByCurrentProcess();
    npas4::GetRAMVirtualUsedByCurrentProcess();
    testing::internal::DoubleNearPredFormat
              ((char *)in_stack_ffffffffffffffd0.data_,(char *)in_stack_ffffffffffffffc8.ptr_,
               (char *)0x11c1ea,unaff_R14,unaff_RBX,(double)in_stack_ffffffffffffffe0.ptr_);
    if (local_28 == '\0') {
      testing::Message::Message((Message *)&stack0xffffffffffffffc8);
      if (in_stack_ffffffffffffffe0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((in_stack_ffffffffffffffe0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x89,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
      if (((in_stack_ffffffffffffffc8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (in_stack_ffffffffffffffc8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffc8.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffffe0,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(npas4, AllocAll)
{
	const auto startCurrentProcess = npas4::GetRAMSystemUsedByCurrentProcess() + npas4::GetRAMVirtualUsedByCurrentProcess();

	// This will always be true, but the compiler won't know that, preventing the
	// allocation from happening before we want it to.
	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		const int64_t allocAmmount = 1052672;
		volatile uint8_t* megabyte = new uint8_t[allocAmmount];

		// Assume we are not swapping out to disk
		auto memoryDelta = npas4::GetRAMSystemUsedByCurrentProcess()  + npas4::GetRAMVirtualUsedByCurrentProcess() - startCurrentProcess;
		EXPECT_NEAR(allocAmmount, memoryDelta, 4096);
		delete[] megabyte;
	}
}